

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

void __thiscall duckdb::CardinalityEstimator::RemoveEmptyTotalDomains(CardinalityEstimator *this)

{
  RelationsToTDom *pRVar1;
  RelationsToTDom *pRVar2;
  const_iterator __first;
  RelationsToTDom *pRVar3;
  long lVar4;
  long lVar5;
  const_iterator __last;
  
  pRVar2 = (this->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->relations_to_tdoms).
       super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
       super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>._M_impl
       .super__Vector_impl_data._M_finish;
  lVar4 = (long)__last._M_current - (long)pRVar2;
  for (lVar5 = lVar4 >> 9; 0 < lVar5; lVar5 = lVar5 + -1) {
    __first._M_current = pRVar2;
    if ((pRVar2->equivalent_relations)._M_h._M_element_count == 0) goto LAB_0121ece0;
    if (pRVar2[1].equivalent_relations._M_h._M_element_count == 0) {
      __first._M_current = pRVar2 + 1;
      goto LAB_0121ece0;
    }
    if (pRVar2[2].equivalent_relations._M_h._M_element_count == 0) {
      __first._M_current = pRVar2 + 2;
      goto LAB_0121ece0;
    }
    if (pRVar2[3].equivalent_relations._M_h._M_element_count == 0) {
      __first._M_current = pRVar2 + 3;
      goto LAB_0121ece0;
    }
    pRVar2 = pRVar2 + 4;
    lVar4 = lVar4 + -0x200;
  }
  lVar4 = lVar4 >> 7;
  if (lVar4 == 1) {
LAB_0121ecc1:
    __first._M_current = pRVar2;
    if ((pRVar2->equivalent_relations)._M_h._M_element_count != 0) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar4 == 2) {
LAB_0121ecb6:
    __first._M_current = pRVar2;
    if ((pRVar2->equivalent_relations)._M_h._M_element_count != 0) {
      pRVar2 = pRVar2 + 1;
      goto LAB_0121ecc1;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar4 != 3) goto LAB_0121ed23;
    __first._M_current = pRVar2;
    if ((pRVar2->equivalent_relations)._M_h._M_element_count != 0) {
      pRVar2 = pRVar2 + 1;
      goto LAB_0121ecb6;
    }
  }
LAB_0121ece0:
  pRVar2 = __first._M_current;
  if (__first._M_current != __last._M_current) {
    while (pRVar3 = __first._M_current + 1, pRVar3 != __last._M_current) {
      pRVar1 = __first._M_current + 1;
      __first._M_current = pRVar3;
      if ((pRVar1->equivalent_relations)._M_h._M_element_count != 0) {
        RelationsToTDom::operator=(pRVar2,pRVar3);
        pRVar2 = pRVar2 + 1;
      }
    }
    __last._M_current =
         (this->relations_to_tdoms).
         super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
         super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = pRVar2;
  }
LAB_0121ed23:
  ::std::vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>::erase
            ((vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_> *)this,
             __first,__last);
  return;
}

Assistant:

void CardinalityEstimator::RemoveEmptyTotalDomains() {
	auto remove_start = std::remove_if(relations_to_tdoms.begin(), relations_to_tdoms.end(),
	                                   [](RelationsToTDom &r_2_tdom) { return r_2_tdom.equivalent_relations.empty(); });
	relations_to_tdoms.erase(remove_start, relations_to_tdoms.end());
}